

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

Gia_Obj_t * Gia_ManAppendObj(Gia_Man_t *p)

{
  int v;
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  
  uVar5 = p->nObjs;
  if (uVar5 == p->nObjsAlloc) {
    uVar1 = uVar5 * 2;
    if (0x1fffffff < (int)(uVar5 * 2)) {
      uVar1 = 0x20000000;
    }
    if (uVar5 == 0x20000000) {
      puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
      exit(1);
    }
    if ((int)uVar1 <= (int)uVar5) {
      __assert_fail("p->nObjs < nObjNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x282,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    if (p->fVerbose != 0) {
      printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar5,(ulong)uVar1);
      uVar5 = p->nObjsAlloc;
    }
    if ((int)uVar5 < 1) {
      __assert_fail("p->nObjsAlloc > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x285,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    lVar4 = (long)(int)uVar1;
    if (p->pObjs == (Gia_Obj_t *)0x0) {
      pGVar2 = (Gia_Obj_t *)malloc(lVar4 * 0xc);
    }
    else {
      pGVar2 = (Gia_Obj_t *)realloc(p->pObjs,lVar4 * 0xc);
      uVar5 = p->nObjsAlloc;
    }
    p->pObjs = pGVar2;
    memset(pGVar2 + (int)uVar5,0,(long)(int)(uVar1 - uVar5) * 0xc);
    if (p->pMuxes != (uint *)0x0) {
      puVar3 = (uint *)realloc(p->pMuxes,lVar4 * 4);
      p->pMuxes = puVar3;
      memset(puVar3 + p->nObjsAlloc,0,(lVar4 - p->nObjsAlloc) * 4);
    }
    p->nObjsAlloc = uVar1;
  }
  if ((p->vHTable).nSize != 0) {
    Vec_IntPush(&p->vHash,0);
  }
  v = p->nObjs;
  p->nObjs = v + 1;
  pGVar2 = Gia_ManObj(p,v);
  return pGVar2;
}

Assistant:

static inline Gia_Obj_t * Gia_ManAppendObj( Gia_Man_t * p )  
{ 
    if ( p->nObjs == p->nObjsAlloc )
    {
        int nObjNew = Abc_MinInt( 2 * p->nObjsAlloc, (1 << 29) );
        if ( p->nObjs == (1 << 29) )
            printf( "Hard limit on the number of nodes (2^29) is reached. Quitting...\n" ), exit(1);
        assert( p->nObjs < nObjNew );
        if ( p->fVerbose )
            printf("Extending GIA object storage: %d -> %d.\n", p->nObjsAlloc, nObjNew );
        assert( p->nObjsAlloc > 0 );
        p->pObjs = ABC_REALLOC( Gia_Obj_t, p->pObjs, nObjNew );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Gia_Obj_t) * (nObjNew - p->nObjsAlloc) );
        if ( p->pMuxes )
        {
            p->pMuxes = ABC_REALLOC( unsigned, p->pMuxes, nObjNew );
            memset( p->pMuxes + p->nObjsAlloc, 0, sizeof(unsigned) * (nObjNew - p->nObjsAlloc) );
        }
        p->nObjsAlloc = nObjNew;
    }
    if ( Vec_IntSize(&p->vHTable) ) Vec_IntPush( &p->vHash, 0 );
    return Gia_ManObj( p, p->nObjs++ );
}